

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O3

void BasicTests::brandaoTest(string *input_file)

{
  pointer pcVar1;
  time_t tVar2;
  string savename;
  long *local_58;
  long local_50;
  long local_48 [2];
  string local_38;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  pcVar1 = (input_file->_M_dataplus)._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + input_file->_M_string_length);
  if (local_50 == 7) {
    local_50 = 0;
    *(undefined1 *)local_58 = 0;
  }
  else {
    std::__cxx11::string::_M_erase((ulong)&local_58,0);
  }
  std::__cxx11::string::erase((ulong)&local_58,local_50 - 2);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,local_58,(undefined1 *)(local_50 + (long)local_58));
  Capacitor_Test_GA(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

void BasicTests::brandaoTest(string input_file) {
    srand(time(NULL));

    string savename = input_file;
    savename.erase(savename.begin(), savename.begin() + 7);
    savename.erase(savename.length() - 2, savename.length() - 1);

//    testeEntradas(savename);//perda total e tensao minima para cada configuration para compara com a tese do leonardo willer

//    Capacitor_Test_Ivo(savename);
    Capacitor_Test_GA(savename);
}